

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,CordBuffer *buffer,size_t size_hint)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_00541818;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  sVar2 = absl::lts_20250127::CordBuffer::length(buffer);
  sVar3 = absl::lts_20250127::CordBuffer::capacity(buffer);
  this->state_ = (sVar2 < sVar3) + kFull;
  pvVar1 = (buffer->rep_).field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.long_rep.rep = (buffer->rep_).field_0.long_rep.rep;
  (this->buffer_).rep_.field_0.long_rep.padding = pvVar1;
  (buffer->rep_).field_0.short_rep.raw_size = '\x01';
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::CordBuffer buffer, size_t size_hint)
    : size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}